

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::BackgroundMarkWeakRefs(Recycler *this)

{
  void *address;
  code *pcVar1;
  bool bVar2;
  char cVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  HeapBlock *pHVar6;
  Type TVar7;
  Type pRVar8;
  undefined1 local_40 [8];
  Iterator iterator;
  
  local_40 = (undefined1  [8])&this->weakReferenceRegionList;
  iterator.list =
       (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)local_40;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    do {
      if (iterator.list ==
          (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      iterator.list =
           (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
           ((iterator.list)->super_SListNodeBase<Memory::HeapAllocator>).next;
      if ((undefined1  [8])iterator.list == local_40) {
        return;
      }
      pTVar5 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
               Iterator::Data((Iterator *)local_40);
      TVar7 = pTVar5->count;
    } while (TVar7 == 0);
    pRVar8 = pTVar5->ptr + 8;
    do {
      address = *(void **)(pRVar8 + -8);
      if ((address != (void *)0x0) && ((*(ulong *)pRVar8 & 1) == 0)) {
        if (*(ulong *)pRVar8 == 0) {
          if (((ulong)address & 0xf) == 0 && (void *)0xffff < address) {
            pHVar6 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,address);
          }
          else {
            pHVar6 = (HeapBlock *)0x0;
          }
          *(HeapBlock **)pRVar8 = pHVar6;
          if (pHVar6 == (HeapBlock *)0x0) goto LAB_0071edd7;
        }
        cVar3 = (**(code **)(**(long **)pRVar8 + 0x58))(*(long **)pRVar8,*(ulong *)(pRVar8 + -8));
        if (cVar3 != '\0') {
          *pRVar8 = (RecyclerWeakReferenceRegionItem<void_*>)((byte)*pRVar8 | 1);
        }
      }
LAB_0071edd7:
      pRVar8 = pRVar8 + 0x10;
      TVar7 = TVar7 - 1;
    } while (TVar7 != 0);
  } while( true );
}

Assistant:

void
Recycler::BackgroundMarkWeakRefs()
{
#if ENABLE_WEAK_REFERENCE_REGIONS
    auto iterator = this->weakReferenceRegionList.GetIterator();
    while (iterator.Next())
    {
        RecyclerWeakReferenceRegion region = iterator.Data();
        RecyclerWeakReferenceRegionItem<void*> *items = region.GetPtr();
        size_t count = region.GetCount();
        for (size_t index = 0; index < count; ++index)
        {
            RecyclerWeakReferenceRegionItem<void*> &item = items[index];
            if (item.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)item.heapBlock & 0x1) == 0x1)
            {
                // This weak reference is already marked
                continue;
            }

            if (item.heapBlock == nullptr)
            {
                item.heapBlock = this->FindHeapBlock(item.ptr);
                if (item.heapBlock == nullptr)
                {
                    // This isn't a real weak reference, ignore it
                    continue;
                }
            }

            if (item.heapBlock->TestObjectMarkedBit(item.ptr))
            {
                item.heapBlock = (HeapBlock*) ((uintptr_t)item.heapBlock | 0x1);
            }
        }
    }
#endif
}